

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void __thiscall ncnn::PoolAllocator::PoolAllocator(PoolAllocator *this)

{
  PoolAllocatorPrivate *this_00;
  Allocator *in_RDI;
  
  in_RDI->_vptr_Allocator = (_func_int **)0x0;
  Allocator::Allocator(in_RDI);
  in_RDI->_vptr_Allocator = (_func_int **)&PTR__PoolAllocator_02024340;
  this_00 = (PoolAllocatorPrivate *)operator_new(0x90);
  PoolAllocatorPrivate::PoolAllocatorPrivate(this_00);
  in_RDI[1]._vptr_Allocator = (_func_int **)this_00;
  *(undefined4 *)(in_RDI[1]._vptr_Allocator + 10) = 0;
  in_RDI[1]._vptr_Allocator[0xb] = (_func_int *)0xa;
  return;
}

Assistant:

PoolAllocator::PoolAllocator()
    : Allocator(), d(new PoolAllocatorPrivate)
{
    d->size_compare_ratio = 0;
    d->size_drop_threshold = 10;
}